

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::Write3dmSettings(ON_BinaryArchive *this,ON_3dmSettings *settings)

{
  ON_SimpleArray<ON_UUID_struct> *this_00;
  int iVar1;
  bool bVar2;
  bool bVar3;
  LengthUnitSystem LVar4;
  ON_3dmSettings *pOVar5;
  long lVar6;
  ON_UUID *uuid;
  
  bVar2 = Begin3dmTable(this,write3dm,settings_table);
  if (bVar2) {
    pOVar5 = this->m_archive_3dm_settings;
    if (pOVar5 != (ON_3dmSettings *)0x0) {
      ON_3dmSettings::~ON_3dmSettings(pOVar5);
      operator_delete(pOVar5,0x618);
      this->m_archive_3dm_settings = (ON_3dmSettings *)0x0;
    }
    bVar2 = BeginWrite3dmBigChunk(this,0x10000015,0);
    if (bVar2) {
      bVar3 = ON_3dmSettings::Write(settings,this);
      bVar2 = EndWrite3dmChunk(this);
      bVar2 = bVar2 && bVar3;
    }
    if ((bVar2 != false) && (this->m_3dm_version == 3)) {
      iVar1 = (settings->m_plugin_list).m_count;
      this_00 = &this->m_V3_plugin_id_list;
      if (-1 < (this->m_V3_plugin_id_list).m_capacity) {
        (this->m_V3_plugin_id_list).m_count = 0;
      }
      ON_SimpleArray<ON_UUID_struct>::SetCapacity(this_00,(long)iVar1 + 5);
      if (0 < iVar1) {
        lVar6 = 0;
        do {
          uuid = (ON_UUID *)((((settings->m_plugin_list).m_a)->m_plugin_id).Data4 + lVar6 + -8);
          bVar3 = ON_UuidIsNil(uuid);
          if (!bVar3) {
            ON_SimpleArray<ON_UUID_struct>::Append(this_00,uuid);
          }
          lVar6 = lVar6 + 0x78;
        } while ((long)iVar1 * 0x78 - lVar6 != 0);
      }
      ON_SimpleArray<ON_UUID_struct>::Append(this_00,&ON_v3_userdata_id);
      ON_SimpleArray<ON_UUID_struct>::Append(this_00,&ON_v4_userdata_id);
      ON_SimpleArray<ON_UUID_struct>::Append(this_00,&ON_opennurbs4_id);
      ON_SimpleArray<ON_UUID_struct>::Append(this_00,&ON_opennurbs5_id);
      ON_SimpleArray<ON_UUID_struct>::Append(this_00,&ON_opennurbs6_id);
      ON_SimpleArray<ON_UUID_struct>::Append(this_00,&ON_opennurbs7_id);
      ON_SimpleArray<ON_UUID_struct>::Append(this_00,&ON_rhino3_id);
      ON_SimpleArray<ON_UUID_struct>::Append(this_00,&ON_rhino4_id);
      ON_SimpleArray<ON_UUID_struct>::Append(this_00,&ON_rhino5_id);
      ON_SimpleArray<ON_UUID_struct>::Append(this_00,&ON_rhino6_id);
      ON_SimpleArray<ON_UUID_struct>::Append(this_00,&ON_rhino7_id);
      ON_SimpleArray<ON_UUID_struct>::QuickSort(this_00,ON_UuidCompare);
    }
    bVar2 = End3dmTable(this,settings_table,bVar2);
    if (bVar2) {
      pOVar5 = (ON_3dmSettings *)operator_new(0x618);
      ON_3dmSettings::ON_3dmSettings(pOVar5,settings);
      this->m_archive_3dm_settings = pOVar5;
      ON_3dmAnnotationContext::SetReferencedAnnotationSettings
                (&this->m_annotation_context,&pOVar5->m_AnnotationSettings);
      LVar4 = ON_UnitSystem::UnitSystem
                        (&(this->m_archive_3dm_settings->m_ModelUnitsAndTolerances).m_unit_system);
      (this->m_annotation_context).m_model_length_unit_system = LVar4;
      LVar4 = ON_UnitSystem::UnitSystem
                        (&(this->m_archive_3dm_settings->m_PageUnitsAndTolerances).m_unit_system);
      (this->m_annotation_context).m_page_length_unit_system = LVar4;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::Write3dmSettings(
      const ON_3dmSettings& settings
      )
{
  if (!Begin3dmTable(ON::archive_mode::write3dm,ON_3dmArchiveTableType::settings_table))
    return false;

  if (nullptr != m_archive_3dm_settings)
  {
    delete m_archive_3dm_settings;
    m_archive_3dm_settings = nullptr;
  }

  // version 2+ file settings chunk
  bool rc = BeginWrite3dmChunk(TCODE_SETTINGS_TABLE,0);
  if ( rc ) {
    rc = settings.Write( *this );
    if ( !EndWrite3dmChunk() )
      rc = false;
  }

  if ( rc && 3 == Archive3dmVersion() )
  {
    // Build a list of ids of plug-ins that support saving
    // V3 user data.  If a plug-in id is not in this list,
    // the user data will not be saved in the V3 archive.
    int i, count = settings.m_plugin_list.Count();
    m_V3_plugin_id_list.SetCount(0);
    m_V3_plugin_id_list.SetCapacity( count+5 );
    for ( i = 0; i < count; i++ )
    {
      const ON_UUID& pid = settings.m_plugin_list[i].m_plugin_id;
      if ( !ON_UuidIsNil(pid) )
        m_V3_plugin_id_list.Append(pid);
    }

    // These ids insure V3, V4 and V5 core user data will round trip
    // through SaveAs V3 and SaveAs V4
    m_V3_plugin_id_list.Append( ON_v3_userdata_id );
    m_V3_plugin_id_list.Append( ON_v4_userdata_id );
    m_V3_plugin_id_list.Append( ON_opennurbs4_id );
    m_V3_plugin_id_list.Append( ON_opennurbs5_id );
    m_V3_plugin_id_list.Append( ON_opennurbs6_id );
    m_V3_plugin_id_list.Append( ON_opennurbs7_id );
    m_V3_plugin_id_list.Append( ON_rhino3_id );
    m_V3_plugin_id_list.Append( ON_rhino4_id );
    m_V3_plugin_id_list.Append( ON_rhino5_id );
    m_V3_plugin_id_list.Append( ON_rhino6_id );
    m_V3_plugin_id_list.Append( ON_rhino7_id );
    m_V3_plugin_id_list.QuickSort( ON_UuidCompare );
  }

  bool final_rc = End3dmTable(ON_3dmArchiveTableType::settings_table,rc);

  if (final_rc)
  {
    m_archive_3dm_settings = new ON_3dmSettings(settings);
    m_annotation_context.SetReferencedAnnotationSettings(&m_archive_3dm_settings->m_AnnotationSettings);
    m_annotation_context.SetModelLengthUnitSystem(m_archive_3dm_settings->m_ModelUnitsAndTolerances.m_unit_system.UnitSystem());
    m_annotation_context.SetPageLengthUnitSystem(m_archive_3dm_settings->m_PageUnitsAndTolerances.m_unit_system.UnitSystem());
  }

  return final_rc;
}